

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

void prf_state_destroy(prf_state_t *state)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = prf_array_count(state->matrix);
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      free(state->matrix[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  free(state->inv_matrix);
  prf_array_free(state->materials);
  prf_array_free(state->textures);
  prf_array_free(state->instances);
  prf_array_free(state->matrix);
  free(state);
  return;
}

Assistant:

void
prf_state_destroy(
    prf_state_t * state )
{
    int cnt, i;
    assert( state != NULL );
    cnt = prf_array_count( state->matrix );
    for ( i = 0; i < cnt; i++ )
        free( state->matrix[i] );
    free( state->inv_matrix );
    prf_array_free( state->materials );
    prf_array_free( state->textures );
    prf_array_free( state->instances );
    prf_array_free( state->matrix );
    free( state );
}